

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O1

void duckdb::ArrayFixedCombine<double,duckdb::CrossProductOp,3ul>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong uVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *count;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  unsigned_long *puVar8;
  pointer pcVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  long lVar15;
  BoundFunctionExpression *pBVar16;
  reference pvVar17;
  Vector *vector;
  Vector *vector_00;
  Vector *pVVar18;
  InvalidInputException *pIVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *idx;
  long lVar21;
  bool bVar22;
  UnifiedVectorFormat rhs_format;
  UnifiedVectorFormat lhs_format;
  string local_160;
  string local_140;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  string local_100;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  pBVar16 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  count = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args->count;
  pvVar17 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector = ArrayVector::GetEntry(pvVar17);
  pvVar17 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  vector_00 = ArrayVector::GetEntry(pvVar17);
  pVVar18 = ArrayVector::GetEntry(result);
  FlatVector::VerifyFlatVector(vector);
  FlatVector::VerifyFlatVector(vector_00);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  pvVar17 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  Vector::ToUnifiedFormat(pvVar17,(idx_t)count,&local_78);
  pvVar17 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  Vector::ToUnifiedFormat(pvVar17,(idx_t)count,&local_c0);
  if (count != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pdVar5 = vector->data;
    pdVar6 = vector_00->data;
    pdVar7 = pVVar18->data;
    idx = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      pbVar20 = idx;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)(local_78.sel)->sel_vector[(long)idx];
      }
      params = idx;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)(local_c0.sel)->sel_vector[(long)idx];
      }
      if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
            [(ulong)pbVar20 >> 6] >> ((ulong)pbVar20 & 0x3f) & 1) != 0)) &&
         ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
            [(ulong)params >> 6] >> ((ulong)params & 0x3f) & 1) != 0)))) {
        uVar10 = (long)pbVar20 * 3;
        puVar8 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar8 != (unsigned_long *)0x0) {
          bVar22 = 0xfffffffffffffffc < uVar10;
          if ((!bVar22) && ((puVar8[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)) {
            lVar15 = 0;
            do {
              lVar21 = lVar15;
              if (lVar21 == 2) break;
              uVar1 = uVar10 + 1 + lVar21;
              lVar15 = lVar21 + 1;
            } while ((puVar8[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) != 0);
            bVar22 = (long)pbVar20 * 3 + 3U <= uVar10 + lVar21 + 1;
          }
          if (!bVar22) {
            pIVar19 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_e0[0] = local_d0;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_e0,"%s: left argument can not contain NULL values","");
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            pcVar9 = (pBVar16->function).super_BaseScalarFunction.super_SimpleFunction.
                     super_Function.name._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_100,pcVar9,
                       pcVar9 + (pBVar16->function).super_BaseScalarFunction.super_SimpleFunction.
                                super_Function.name._M_string_length);
            StringUtil::Format<std::__cxx11::string>
                      (&local_160,(StringUtil *)local_e0,&local_100,params);
            InvalidInputException::InvalidInputException(pIVar19,(string *)&local_160);
            __cxa_throw(pIVar19,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
        }
        uVar10 = (long)params * 3;
        puVar8 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar8 != (unsigned_long *)0x0) {
          bVar22 = 0xfffffffffffffffc < uVar10;
          params_00 = params;
          if ((!bVar22) && ((puVar8[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)) {
            params_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)params * 3 + 3);
            lVar15 = 0;
            do {
              lVar21 = lVar15;
              if (lVar21 == 2) break;
              uVar1 = uVar10 + 1 + lVar21;
              lVar15 = lVar21 + 1;
            } while ((puVar8[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) != 0);
            bVar22 = params_00 <=
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (uVar10 + lVar21 + 1);
          }
          if (!bVar22) {
            pIVar19 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_120[0] = local_110;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_120,"%s: right argument can not contain NULL values","");
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            pcVar9 = (pBVar16->function).super_BaseScalarFunction.super_SimpleFunction.
                     super_Function.name._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,pcVar9,
                       pcVar9 + (pBVar16->function).super_BaseScalarFunction.super_SimpleFunction.
                                super_Function.name._M_string_length);
            StringUtil::Format<std::__cxx11::string>
                      (&local_160,(StringUtil *)local_120,&local_140,params_00);
            InvalidInputException::InvalidInputException(pIVar19,(string *)&local_160);
            __cxa_throw(pIVar19,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
        }
        dVar3 = *(double *)(pdVar5 + (long)pbVar20 * 0x18);
        dVar4 = *(double *)(pdVar6 + (long)params * 0x18);
        pdVar2 = (double *)(pdVar5 + (long)pbVar20 * 0x18 + 8);
        dVar11 = *pdVar2;
        dVar12 = pdVar2[1];
        pdVar2 = (double *)(pdVar6 + (long)params * 0x18 + 8);
        dVar13 = *pdVar2;
        dVar14 = pdVar2[1];
        pdVar2 = (double *)(pdVar7 + (long)idx * 0x18);
        *pdVar2 = dVar14 * dVar11 - dVar12 * dVar13;
        pdVar2[1] = dVar4 * dVar12 - dVar3 * dVar14;
        *(double *)(pdVar7 + (long)idx * 0x18 + 0x10) = dVar3 * dVar13 - dVar4 * dVar11;
      }
      else {
        FlatVector::SetNull(result,(idx_t)idx,true);
      }
      idx = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(idx->_M_dataplus)._M_p + 1);
    } while (idx != count);
    if (count == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001)
    {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ArrayFixedCombine(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);
	auto &res_child = ArrayVector::GetEntry(result);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(res_child);

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * N;
		if (!lhs_child_validity.CheckAllValid(left_offset + N, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * N;
		if (!rhs_child_validity.CheckAllValid(right_offset + N, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}
		const auto result_offset = i * N;

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;
		const auto res_data_ptr = res_data + result_offset;

		OP::Operation(lhs_data_ptr, rhs_data_ptr, res_data_ptr, N);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}